

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O3

void __thiscall slang::ast::TypePrinter::printUnpackedArrayDim(TypePrinter *this,Type *type)

{
  SymbolKind SVar1;
  ulong uVar2;
  Type *this_00;
  unsigned_long_long uVar3;
  size_t sVar4;
  char *pcVar5;
  char *begin;
  Type *type_00;
  FormatBuffer *this_01;
  FixedSizeUnpackedArrayType *at;
  format_args args;
  string_view fmt;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  undefined4 local_28;
  
  SVar1 = (type->super_Symbol).kind;
  if (4 < SVar1 - FixedSizeUnpackedArrayType) {
    return;
  }
  switch(SVar1) {
  case FixedSizeUnpackedArrayType:
    this_01 = (this->buffer)._M_t.
              super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>.
              _M_t.
              super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
              .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl;
    local_38._M_len = CONCAT44(local_38._M_len._4_4_,(int)type[1].super_Symbol.name._M_len);
    local_28 = *(undefined4 *)((long)&type[1].super_Symbol.name._M_len + 4);
    pcVar5 = "[{}:{}]";
    sVar4 = 7;
    uVar3 = 0x11;
    break;
  default:
    this_01 = (this->buffer)._M_t.
              super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>.
              _M_t.
              super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
              .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl;
    begin = "[]";
    pcVar5 = "";
    goto LAB_008c57ba;
  case AssociativeArrayType:
    this_01 = (this->buffer)._M_t.
              super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>.
              _M_t.
              super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
              .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl;
    if (type[1].super_Symbol.name._M_len == 0) {
      begin = "[*]";
      pcVar5 = "";
    }
    else {
      ::fmt::v11::detail::buffer<char>::append<char>((buffer<char> *)this_01,"[","");
      local_38._M_len = 0;
      local_38._M_str = "";
      Symbol::visit<slang::ast::TypePrinter&,std::basic_string_view<char,std::char_traits<char>>>
                ((Symbol *)type[1].super_Symbol.name._M_len,this,&local_38);
      this_01 = (this->buffer)._M_t.
                super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
                ._M_t.
                super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
                .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl;
      begin = "]";
      pcVar5 = "";
    }
LAB_008c57ba:
    ::fmt::v11::detail::buffer<char>::append<char>((buffer<char> *)this_01,begin,pcVar5);
    goto LAB_008c57bf;
  case QueueType:
    uVar2 = (ulong)(uint)type[1].super_Symbol.name._M_len;
    this_01 = (this->buffer)._M_t.
              super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>.
              _M_t.
              super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
              .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl;
    if (uVar2 == 0) {
      begin = "[$]";
      pcVar5 = "";
      goto LAB_008c57ba;
    }
    pcVar5 = "[$:{}]";
    sVar4 = 6;
    uVar3 = 2;
    local_38._M_len = uVar2;
  }
  args.field_1.values_ = (value<fmt::v11::context> *)&local_38;
  args.desc_ = uVar3;
  fmt.size_ = sVar4;
  fmt.data_ = pcVar5;
  ::fmt::v11::detail::vformat_to((buffer<char> *)this_01,fmt,args,(locale_ref)0x0);
LAB_008c57bf:
  this_00 = Type::getArrayElementType(type);
  type_00 = this_00->canonical;
  if (type_00 == (Type *)0x0) {
    Type::resolveCanonical(this_00);
    type_00 = this_00->canonical;
  }
  printUnpackedArrayDim(this,type_00);
  return;
}

Assistant:

void TypePrinter::printUnpackedArrayDim(const Type& type) {
    switch (type.kind) {
        case SymbolKind::FixedSizeUnpackedArrayType: {
            auto& at = type.as<FixedSizeUnpackedArrayType>();
            buffer->format("[{}:{}]", at.range.left, at.range.right);
            break;
        }
        case SymbolKind::DynamicArrayType:
        case SymbolKind::DPIOpenArrayType:
            buffer->append("[]");
            break;
        case SymbolKind::AssociativeArrayType: {
            auto& at = type.as<AssociativeArrayType>();
            if (!at.indexType) {
                buffer->append("[*]");
            }
            else {
                buffer->append("[");
                at.indexType->visit(*this, ""sv);
                buffer->append("]");
            }
            break;
        }
        case SymbolKind::QueueType: {
            auto& at = type.as<QueueType>();
            if (at.maxBound)
                buffer->format("[$:{}]", at.maxBound);
            else
                buffer->append("[$]");
            break;
        }
        default:
            return;
    }

    // We can only reach this if we know we have an array type.
    printUnpackedArrayDim(type.getArrayElementType()->getCanonicalType());
}